

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::insert_hint_unique<std::pair<int,int>const&>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          *this,iterator position,key_type *key,pair<int,_int> *args)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  iterator iVar6;
  iterator prev;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_48;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_38;
  
  local_48.node = position.node;
  local_48.position = position.position;
  if (*(long *)(this + 0x10) == 0) {
LAB_0020125e:
    insert_unique<std::pair<int,int>const&>(__return_storage_ptr__,this,key,args);
  }
  else {
    iVar6 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)this);
    if (local_48.node == iVar6.node && local_48.position == iVar6.position) {
LAB_00201160:
      local_38._12_4_ = local_48._12_4_;
      local_38.position = local_48.position;
      local_38.node = local_48.node;
      iVar6 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      if ((local_48.node != iVar6.node) || (local_48.position != iVar6.position)) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
        ::decrement(&local_38);
        if (((ulong)local_38.node & 7) != 0) {
LAB_0020128d:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if ((key->first <= *(int *)(local_38.node + (long)local_38.position * 8 + 0xc)) &&
           ((key->first < *(int *)(local_38.node + (long)local_38.position * 8 + 0xc) ||
            (key->second <= *(int *)(local_38.node + (long)local_38.position * 8 + 0x10)))))
        goto LAB_0020125e;
      }
      uVar5 = (ulong)(uint)local_48.position;
    }
    else {
      if (((ulong)local_48.node & 7) != 0) goto LAB_0020128d;
      lVar4 = (long)local_48.position;
      iVar1 = key->first;
      iVar2 = *(int *)(local_48.node + lVar4 * 8 + 0xc);
      if ((iVar1 < iVar2) ||
         ((iVar1 <= iVar2 && (key->second < *(int *)(local_48.node + lVar4 * 8 + 0x10)))))
      goto LAB_00201160;
      bVar3 = iVar2 < iVar1;
      if (iVar2 == iVar1) {
        bVar3 = *(int *)(local_48.node + lVar4 * 8 + 0x10) < key->second;
      }
      if (!bVar3) {
        (__return_storage_ptr__->first).node = local_48.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_48._12_4_,local_48.position);
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
      ::increment(&local_48);
      iVar6 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)this);
      uVar5 = (ulong)(uint)local_48.position;
      if (local_48.node != iVar6.node || local_48.position != iVar6.position) {
        if (((ulong)local_48.node & 7) != 0) goto LAB_0020128d;
        if ((*(int *)(local_48.node + (long)local_48.position * 8 + 0xc) <= key->first) &&
           ((*(int *)(local_48.node + (long)local_48.position * 8 + 0xc) < key->first ||
            (*(int *)(local_48.node + (long)local_48.position * 8 + 0x10) <= key->second))))
        goto LAB_0020125e;
      }
    }
    iVar6._8_8_ = uVar5;
    iVar6.node = local_48.node;
    iVar6 = internal_emplace<std::pair<int,int>const&>(this,iVar6,args);
    (__return_storage_ptr__->first).node = iVar6.node;
    (__return_storage_ptr__->first).position = iVar6.position;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }